

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O3

light_option light_create_option(uint16_t option_code,uint16_t option_length,void *option_value)

{
  light_option p_Var1;
  uint32_t *__dest;
  ulong uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  uVar3 = CONCAT62(in_register_00000032,option_length);
  p_Var1 = (light_option)calloc(1,0x18);
  uVar2 = (ulong)(((uint)uVar3 & 0xfffffffc) + 4);
  if ((option_length & 3) == 0) {
    uVar2 = uVar3 & 0xffffffff;
  }
  p_Var1->custom_option_code = option_code;
  p_Var1->option_length = (uint16_t)(uVar3 & 0xffffffff);
  __dest = (uint32_t *)calloc(uVar2 & 0xffff,1);
  p_Var1->data = __dest;
  memcpy(__dest,option_value,uVar3 & 0xffffffff);
  return p_Var1;
}

Assistant:

light_option light_create_option(const uint16_t option_code, uint16_t option_length, void *option_value)
{
	uint16_t size = 0;
	light_option option = calloc(1, sizeof(struct _light_option));

	PADD32(option_length, &size);
	option->custom_option_code = option_code;
	option->option_length = option_length;

	option->data = calloc(size, sizeof(uint8_t));
	memcpy(option->data, option_value, option_length);

	return option;
}